

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O1

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize,int extDict)

{
  rawSeq *prVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  seqDef *psVar4;
  uint uVar5;
  uint uVar6;
  ZSTD_blockCompressor p_Var7;
  size_t sVar8;
  undefined8 *puVar9;
  uint uVar10;
  uint uVar11;
  BYTE *pBVar12;
  void *pvVar13;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  int local_60;
  U32 UVar14;
  
  uVar6 = cParams->searchLength;
  p_Var7 = ZSTD_selectBlockCompressor(cParams->strategy,extDict);
  pBVar3 = (ms->window).base;
  pvVar13 = (void *)(srcSize + (long)src);
  do {
    uVar15 = rawSeqStore->pos;
    local_60 = (int)pBVar3;
    if ((rawSeqStore->size <= uVar15) || (pvVar13 <= src)) break;
    prVar1 = rawSeqStore->seq + uVar15;
    uVar16._0_4_ = prVar1->offset;
    uVar16._4_4_ = prVar1->litLength;
    uVar18 = uVar16 >> 0x20;
    uVar11 = rawSeqStore->seq[uVar15].matchLength;
    uVar5 = (uint)((long)pvVar13 - (long)src);
    if (uVar5 < uVar11 + uVar16._4_4_) {
      uVar15 = uVar16;
      if (uVar5 - uVar16._4_4_ < uVar6) {
        uVar15 = 0;
      }
      uVar10 = uVar5 - uVar16._4_4_;
      if (uVar5 < (uint)uVar16._4_4_ || uVar5 - uVar16._4_4_ == 0) {
        uVar15 = 0;
        uVar10 = uVar11;
      }
      uVar11 = uVar10;
      ZSTD_ldm_skipSequences(rawSeqStore,(long)pvVar13 - (long)src & 0xffffffff,uVar6);
      uVar16 = uVar15;
    }
    else {
      rawSeqStore->pos = uVar15 + 1;
    }
    UVar14 = (U32)uVar16;
    if (UVar14 != 0) {
      uVar5 = (int)src - *(int *)&(ms->window).base;
      if (ms->nextToUpdate + 0x400 < uVar5) {
        uVar10 = (uVar5 - ms->nextToUpdate) - 0x400;
        if (0x1ff < uVar10) {
          uVar10 = 0x200;
        }
        ms->nextToUpdate = uVar5 - uVar10;
      }
      ZSTD_ldm_fillFastTables(ms,cParams,src);
      sVar8 = (*p_Var7)(ms,seqStore,rep,cParams,src,uVar18);
      lVar17 = (long)src + uVar18;
      ms->nextToUpdate = (int)lVar17 - local_60;
      *(undefined8 *)(rep + 1) = *(undefined8 *)rep;
      *rep = UVar14;
      puVar9 = (undefined8 *)(lVar17 - sVar8);
      pBVar12 = seqStore->lit;
      pBVar2 = pBVar12 + sVar8;
      do {
        *(undefined8 *)pBVar12 = *puVar9;
        pBVar12 = pBVar12 + 8;
        puVar9 = puVar9 + 1;
      } while (pBVar12 < pBVar2);
      seqStore->lit = seqStore->lit + sVar8;
      if (0xffff < sVar8) {
        seqStore->longLengthID = 1;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
      psVar4 = seqStore->sequences;
      psVar4->litLength = (U16)sVar8;
      psVar4->offset = UVar14 + 3;
      if (0xffff < uVar11 - 3) {
        seqStore->longLengthID = 2;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar4 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar4->matchLength = (U16)(uVar11 - 3);
      seqStore->sequences = psVar4 + 1;
      src = (void *)(lVar17 + (ulong)uVar11);
    }
  } while (UVar14 != 0);
  uVar6 = (int)src - *(int *)&(ms->window).base;
  if (ms->nextToUpdate + 0x400 < uVar6) {
    uVar11 = (uVar6 - ms->nextToUpdate) - 0x400;
    if (0x1ff < uVar11) {
      uVar11 = 0x200;
    }
    ms->nextToUpdate = uVar6 - uVar11;
  }
  ZSTD_ldm_fillFastTables(ms,cParams,src);
  sVar8 = (*p_Var7)(ms,seqStore,rep,cParams,src,(long)pvVar13 - (long)src);
  ms->nextToUpdate = (int)pvVar13 - local_60;
  return sVar8;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize,
    int const extDict)
{
    unsigned const minMatch = cParams->searchLength;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, extDict);
    BYTE const* const base = ms->window.base;
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the lits */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(sequence.offset <= (1U << cParams->windowLog));
        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, cParams, ip);
        /* Run the block compressor */
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, cParams, ip,
                                sequence.litLength);
            ip += sequence.litLength;
            ms->nextToUpdate = (U32)(ip - base);
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength,
                          sequence.offset + ZSTD_REP_MOVE,
                          sequence.matchLength - MINMATCH);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, cParams, ip);
    /* Compress the last literals */
    {
        size_t const lastLiterals = blockCompressor(ms, seqStore, rep, cParams,
                                                    ip, iend - ip);
        ms->nextToUpdate = (U32)(iend - base);
        return lastLiterals;
    }
}